

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

void player_place(chunk_conflict2 *c,player *p,loc grid)

{
  loc grid_00;
  loc grid_01;
  loc grid_02;
  _Bool _Var1;
  monster *pmVar2;
  square *psVar3;
  
  pmVar2 = square_monster((chunk_conflict *)c,grid);
  if (pmVar2 == (monster *)0x0) {
    grid_00.x = (p->grid).x;
    grid_00.y = (p->grid).y;
    _Var1 = square_in_bounds((chunk_conflict *)c,grid_00);
    if (_Var1) {
      grid_01.x = (p->grid).x;
      grid_01.y = (p->grid).y;
      psVar3 = square((chunk_conflict *)c,grid_01);
      if (psVar3->mon == -1) {
        grid_02.x = (p->grid).x;
        grid_02.y = (p->grid).y;
        square_set_mon((chunk_conflict *)c,grid_02,L'\0');
      }
    }
    (p->grid).x = grid.x;
    (p->grid).y = grid.y;
    square_set_mon((chunk_conflict *)c,grid,L'\xffffffff');
    p->upkeep->create_stair = L'\0';
    return;
  }
  __assert_fail("!square_monster(c, grid)",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-util.c"
                ,0x71e,"void player_place(struct chunk *, struct player *, struct loc)");
}

Assistant:

void player_place(struct chunk *c, struct player *p, struct loc grid)
{
	assert(!square_monster(c, grid));

	/* Unmark previous grid */
	if (square_in_bounds(c, p->grid) && (square(c, p->grid)->mon == -1)) {
		square_set_mon(c, p->grid, 0);
	}

	/* Save player location */
	p->grid = grid;

	/* Mark grid */
	square_set_mon(c, grid, -1);

	/* Clear stair creation */
	p->upkeep->create_stair = 0;
}